

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdmiCecAnalyzerSettings.cpp
# Opt level: O0

void __thiscall HdmiCecAnalyzerSettings::LoadSettings(HdmiCecAnalyzerSettings *this,char *settings)

{
  char *pcVar1;
  SimpleArchive local_20 [8];
  SimpleArchive text_archive;
  char *settings_local;
  HdmiCecAnalyzerSettings *this_local;
  
  _text_archive = settings;
  SimpleArchive::SimpleArchive(local_20);
  SimpleArchive::SetString((char *)local_20);
  SimpleArchive::operator>>(local_20,&this->mCecChannel);
  AnalyzerSettings::ClearChannels();
  pcVar1 = HdmiCec::GetProtocolName();
  AnalyzerSettings::AddChannel((Channel *)this,(char *)&this->mCecChannel,SUB81(pcVar1,0));
  UpdateInterfacesFromSettings(this);
  SimpleArchive::~SimpleArchive(local_20);
  return;
}

Assistant:

void HdmiCecAnalyzerSettings::LoadSettings( const char* settings )
{
    SimpleArchive text_archive;
    text_archive.SetString( settings );

    text_archive >> mCecChannel;

    ClearChannels();
    AddChannel( mCecChannel, HdmiCec::GetProtocolName(), true );

    UpdateInterfacesFromSettings();
}